

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void cmServer::reportMessage(string *msg,char *title,cmServerRequest *request)

{
  undefined1 local_40 [8];
  string titleString;
  cmServerRequest *request_local;
  char *title_local;
  string *msg_local;
  
  titleString.field_2._8_8_ = request;
  std::__cxx11::string::string((string *)local_40);
  if (title != (char *)0x0) {
    std::__cxx11::string::operator=((string *)local_40,title);
  }
  cmServerRequest::ReportMessage
            ((cmServerRequest *)titleString.field_2._8_8_,msg,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmServer::reportMessage(const std::string& msg, const char* title,
                             const cmServerRequest& request)
{
  std::string titleString;
  if (title) {
    titleString = title;
  }
  request.ReportMessage(msg, titleString);
}